

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O3

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:76:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:87:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:97:36)>_>
::_on_pipe(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
           *this,Pipeflow *pf,Runtime *rt)

{
  size_t sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer pbVar3;
  size_type sVar4;
  pointer pcVar5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  variant_alternative_t<0UL,_variant<basic_string<char>,_unordered_map<char,_unsigned_long,_hash<char>,_equal_to<char>,_allocator<pair<const_char,_unsigned_long>_>_>,_pair<char,_unsigned_long>_>_>
  *pvVar8;
  mapped_type *pmVar9;
  variant_alternative_t<1UL,_variant<basic_string<char>,_unordered_map<char,_unsigned_long,_hash<char>,_equal_to<char>,_allocator<pair<const_char,_unsigned_long>_>_>,_pair<char,_unsigned_long>_>_>
  *pvVar10;
  _Hash_node_base *p_Var11;
  size_type sVar12;
  char c;
  unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  map;
  string local_88;
  _Hashtable<char,_std::pair<const_char,_unsigned_long>,_std::allocator<std::pair<const_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  sVar1 = pf->_pipe;
  if (sVar1 == 2) {
    pvVar10 = std::
              get<1ul,std::__cxx11::string,std::unordered_map<char,unsigned_long,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,unsigned_long>>>,std::pair<char,unsigned_long>>
                        (((this->_pipes).
                          super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                          .
                          super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                          .
                          super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                          .
                          super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>,_false>
                          ._M_head_impl._callable.buffer)->_M_elems + pf->_line);
    p_Var6 = (pvVar10->_M_h)._M_before_begin._M_nxt;
    p_Var7 = p_Var6->_M_nxt;
    for (; p_Var7 != (_Hash_node_base *)0x0; p_Var7 = p_Var7->_M_nxt) {
      p_Var11 = p_Var7;
      if (p_Var7[2]._M_nxt <= p_Var6[2]._M_nxt) {
        p_Var11 = p_Var6;
      }
      p_Var6 = p_Var11;
    }
    printf("stage 3: %c:%zu\n",(ulong)(uint)(int)*(char *)&p_Var6[1]._M_nxt,p_Var6[2]._M_nxt);
    return;
  }
  if (sVar1 == 1) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    pvVar8 = std::
             get<0ul,std::__cxx11::string,std::unordered_map<char,unsigned_long,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,unsigned_long>>>,std::pair<char,unsigned_long>>
                       (((this->_pipes).
                         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                         .
                         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                         .
                         super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_false>
                         ._M_head_impl._callable.buffer)->_M_elems + pf->_line);
    sVar4 = pvVar8->_M_string_length;
    if (sVar4 != 0) {
      pcVar5 = (pvVar8->_M_dataplus)._M_p;
      sVar12 = 0;
      do {
        local_88._M_dataplus._M_p._0_1_ = pcVar5[sVar12];
        pmVar9 = std::__detail::
                 _Map_base<char,_std::pair<const_char,_unsigned_long>,_std::allocator<std::pair<const_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<char,_std::pair<const_char,_unsigned_long>,_std::allocator<std::pair<const_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,(key_type *)&local_88);
        *pmVar9 = *pmVar9 + 1;
        sVar12 = sVar12 + 1;
      } while (sVar4 != sVar12);
    }
    std::
    variant<std::__cxx11::string,std::unordered_map<char,unsigned_long,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,unsigned_long>>>,std::pair<char,unsigned_long>>
    ::operator=((variant<std::__cxx11::string,std::unordered_map<char,unsigned_long,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,unsigned_long>>>,std::pair<char,unsigned_long>>
                 *)(((this->_pipes).
                     super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                     .
                     super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                     .
                     super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_false>
                     ._M_head_impl._callable.buffer)->_M_elems + pf->_line),
                (unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                 *)&local_68);
    format_map_abi_cxx11_
              (&local_88,
               (unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                *)&local_68);
    printf("stage 2: map = %s\n",
           CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p),
                      local_88.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<char,_std::pair<const_char,_unsigned_long>,_std::allocator<std::pair<const_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
  }
  else if (sVar1 == 0) {
    pvVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
             .
             super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_false>
             ._M_head_impl._callable.input;
    pbVar3 = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pf->_token !=
        (long)(pvVar2->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) {
      std::
      variant<std::__cxx11::string,std::unordered_map<char,unsigned_long,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,unsigned_long>>>,std::pair<char,unsigned_long>>
      ::operator=((variant<std::__cxx11::string,std::unordered_map<char,unsigned_long,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,unsigned_long>>>,std::pair<char,unsigned_long>>
                   *)(((this->_pipes).
                       super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
                       .
                       super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_false>
                       ._M_head_impl._callable.buffer)->_M_elems + pf->_line),pbVar3 + pf->_token);
      printf("stage 1: input token = %s\n",
             (((this->_pipes).
               super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
               .
               super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_false>
               ._M_head_impl._callable.input)->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[pf->_token]._M_dataplus._M_p);
      return;
    }
    pf->_stop = true;
  }
  return;
}

Assistant:

void Pipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime& rt) {
  visit_tuple([&](auto&& pipe){
    using callable_t = typename std::decay_t<decltype(pipe)>::callable_t;
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      pipe._callable(pf);
    }
    else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
      pipe._callable(pf, rt);
    }
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}